

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecAtt.h
# Opt level: O2

void Vec_AttGrow(Vec_Att_t *p,int nCapMin)

{
  void **ppvVar1;
  int iVar2;
  
  iVar2 = p->nCap;
  if (iVar2 < nCapMin) {
    if (p->pArrayPtr == (void **)0x0) {
      ppvVar1 = (void **)malloc((long)nCapMin << 3);
    }
    else {
      ppvVar1 = (void **)realloc(p->pArrayPtr,(long)nCapMin << 3);
      iVar2 = p->nCap;
    }
    p->pArrayPtr = ppvVar1;
    memset(ppvVar1 + iVar2,0,(long)(nCapMin - iVar2) << 3);
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_AttGrow( Vec_Att_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArrayPtr = ABC_REALLOC( void *, p->pArrayPtr, nCapMin );
    memset( p->pArrayPtr + p->nCap, 0, sizeof(void *) * (nCapMin - p->nCap) );
    p->nCap = nCapMin;
}